

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nl-writer2.h
# Opt level: O0

void __thiscall
mp::NLWriter2<mp::NLWriter2Params<mp::BinaryFormatter,_ExampleNLFeeder>_>::NLWriter2
          (NLWriter2<mp::NLWriter2Params<mp::BinaryFormatter,_ExampleNLFeeder>_> *this,FeederType *f
          ,NLHeader h,NLUtils *utl)

{
  bool bVar1;
  int iVar2;
  NLUtils *in_RDX;
  NLUtils *in_RSI;
  BinaryFormatter *in_RDI;
  char (*in_stack_ffffffffffffffd0) [1];
  NLW2_WriteNLResultCode *in_stack_ffffffffffffffd8;
  uint in_stack_ffffffffffffffe0;
  
  bVar1 = ExampleNLFeeder::WantNLComments((ExampleNLFeeder *)in_RSI);
  iVar2 = NLFeeder<ExampleModel,_void_*>::OutputPrecision((NLFeeder<ExampleModel,_void_*> *)in_RSI);
  BinaryFormatter::BinaryFormatter(in_RDI,in_RDX,bVar1,iVar2);
  in_RDI[1].utils_ = in_RSI;
  memcpy(in_RDI + 2,&stack0x00000008,0x110);
  *(undefined4 *)((long)&in_RDI[0x24].utils_ + 4) = 0;
  *(undefined4 *)&in_RDI[0x25].utils_ = 0;
  *(undefined4 *)((long)&in_RDI[0x25].utils_ + 4) = 0;
  File::File((File *)(in_RDI + 0x26));
  std::
  pair<NLW2_WriteNLResultCode,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  ::pair<NLW2_WriteNLResultCode,_const_char_(&)[1],_true>
            ((pair<NLW2_WriteNLResultCode,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
              *)(ulong)in_stack_ffffffffffffffe0,in_stack_ffffffffffffffd8,in_stack_ffffffffffffffd0
            );
  return;
}

Assistant:

NLWriter2(FeederType& f, NLHeader h, NLUtils& utl) :
    FormatterType(utl, f.WantNLComments(), f.OutputPrecision()),
    feeder_(f), header_(h) { }